

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void print_args(float x,float y)

{
  ostream *poVar1;
  float y_local;
  float x_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"The arguments are ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1," and ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_args(float x, float y)
{
    std::cout << "The arguments are " << x << " and " << y << std::endl;
}